

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O2

blargg_err_t __thiscall Gym_File::track_info_(Gym_File *this,track_info_t *out,int param_2)

{
  header_t *h;
  long length;
  
  h = (header_t *)this->file_begin;
  length = gym_track_length((byte_ *)(h->tag + this->data_offset),this->file_end);
  get_gym_info(h,length,out);
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t track_info_( track_info_t* out, int ) const
	{
		long length = gym_track_length( &file_begin [data_offset], file_end );
		get_gym_info( *(Gym_Emu::header_t const*) file_begin, length, out );
		return 0;
	}